

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

void worker_error(worker_thread *thr,lzma_ret ret)

{
  lzma_stream_coder_conflict1 *plVar1;
  bool bVar2;
  int iVar3;
  
  if (ret == LZMA_OK) {
    __assert_fail("ret != LZMA_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0xb8,"void worker_error(worker_thread *, lzma_ret)");
  }
  if (ret != LZMA_STREAM_END) {
    bVar2 = true;
    while( true ) {
      if (bVar2) {
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)&thr->coder->mutex);
        if (iVar3 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
        }
      }
      else {
        iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&thr->coder->mutex);
        if (iVar3 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
        }
      }
      if (!bVar2) break;
      plVar1 = thr->coder;
      if (plVar1->thread_error == LZMA_OK) {
        plVar1->thread_error = ret;
      }
      iVar3 = pthread_cond_signal((pthread_cond_t *)&plVar1->cond);
      bVar2 = false;
      if (iVar3 != 0) {
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0x10c,"void mythread_cond_signal(mythread_cond *)");
      }
    }
    return;
  }
  __assert_fail("ret != LZMA_STREAM_END",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                ,0xb9,"void worker_error(worker_thread *, lzma_ret)");
}

Assistant:

static void
worker_error(worker_thread *thr, lzma_ret ret)
{
	assert(ret != LZMA_OK);
	assert(ret != LZMA_STREAM_END);

	mythread_sync(thr->coder->mutex) {
		if (thr->coder->thread_error == LZMA_OK)
			thr->coder->thread_error = ret;

		mythread_cond_signal(&thr->coder->cond);
	}

	return;
}